

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_os_rename(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  uint uVar1;
  char *ptr;
  char *__new;
  int *piVar2;
  JSValueUnion JVar3;
  int64_t iVar4;
  JSValue JVar5;
  
  JVar3.float64 = 0.0;
  ptr = JS_ToCStringLen2(ctx,(size_t *)0x0,*argv,0);
  iVar4 = 6;
  if (ptr != (char *)0x0) {
    __new = JS_ToCStringLen2(ctx,(size_t *)0x0,argv[1],0);
    if (__new == (char *)0x0) {
      JS_FreeCString(ctx,ptr);
      JVar3.float64 = 0.0;
    }
    else {
      uVar1 = rename(ptr,__new);
      if (uVar1 == 0xffffffff) {
        piVar2 = __errno_location();
        uVar1 = -*piVar2;
      }
      JS_FreeCString(ctx,ptr);
      JS_FreeCString(ctx,__new);
      JVar3._4_4_ = 0;
      JVar3.int32 = uVar1;
      iVar4 = 0;
    }
  }
  JVar5.tag = iVar4;
  JVar5.u.float64 = JVar3.float64;
  return JVar5;
}

Assistant:

static JSValue js_os_rename(JSContext *ctx, JSValueConst this_val,
                            int argc, JSValueConst *argv)
{
    const char *oldpath, *newpath;
    int ret;
    
    oldpath = JS_ToCString(ctx, argv[0]);
    if (!oldpath)
        return JS_EXCEPTION;
    newpath = JS_ToCString(ctx, argv[1]);
    if (!newpath) {
        JS_FreeCString(ctx, oldpath);
        return JS_EXCEPTION;
    }
    ret = js_get_errno(rename(oldpath, newpath));
    JS_FreeCString(ctx, oldpath);
    JS_FreeCString(ctx, newpath);
    return JS_NewInt32(ctx, ret);
}